

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

bool __thiscall QWizardPrivate::buttonLayoutContains(QWizardPrivate *this,WizardButton which)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long in_RCX;
  long lVar4;
  
  if (this->buttonsHaveCustomLayout != true) {
    return true;
  }
  lVar2 = (this->buttonsCustomLayout).d.size;
  if (lVar2 != 0) {
    lVar4 = -4;
    do {
      lVar1 = lVar2 * -4 + lVar4;
      if (lVar1 == -4) goto LAB_00516c46;
      in_RCX = lVar4 + 4;
      lVar3 = lVar4 + 4;
      lVar4 = in_RCX;
    } while (*(WizardButton *)((long)(this->buttonsCustomLayout).d.ptr + lVar3) != which);
    in_RCX = in_RCX >> 2;
LAB_00516c46:
    if (lVar1 != -4) goto LAB_00516c53;
  }
  in_RCX = -1;
LAB_00516c53:
  return in_RCX != -1;
}

Assistant:

bool QWizardPrivate::buttonLayoutContains(QWizard::WizardButton which)
{
    return !buttonsHaveCustomLayout || buttonsCustomLayout.contains(which);
}